

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collider.cxx
# Opt level: O0

NucleusPtr glauber::anon_unknown_6::create_nucleus(VarMap *var_map,size_t index)

{
  const_reference pvVar1;
  double *pdVar2;
  double in_RSI;
  tuple<glauber::Nucleus_*,_std::default_delete<glauber::Nucleus>_> in_RDI;
  double *nucleon_width;
  value_type *species;
  string *in_stack_ffffffffffffff18;
  variables_map *in_stack_ffffffffffffff20;
  allocator local_81;
  string local_80 [32];
  double *local_60;
  allocator local_41;
  string local_40 [32];
  const_reference local_20;
  _Head_base<0UL,_glauber::Nucleus_*,_false> species_00;
  
  species_00._M_head_impl =
       (Nucleus *)
       in_RDI.super__Tuple_impl<0UL,_glauber::Nucleus_*,_std::default_delete<glauber::Nucleus>_>.
       super__Head_base<0UL,_glauber::Nucleus_*,_false>._M_head_impl;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"projectile",&local_41);
  boost::program_options::variables_map::operator[]
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  boost::program_options::variable_value::
  as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((variable_value *)0x16d1f9);
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = pvVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"nucleon-width",&local_81);
  boost::program_options::variables_map::operator[]
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  pdVar2 = boost::program_options::variable_value::as<double>((variable_value *)0x16d294);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_60 = pdVar2;
  Nucleus::create((string *)species_00._M_head_impl,in_RSI);
  return (__uniq_ptr_data<glauber::Nucleus,_std::default_delete<glauber::Nucleus>,_true,_true>)
         (__uniq_ptr_data<glauber::Nucleus,_std::default_delete<glauber::Nucleus>,_true,_true>)
         in_RDI.super__Tuple_impl<0UL,_glauber::Nucleus_*,_std::default_delete<glauber::Nucleus>_>.
         super__Head_base<0UL,_glauber::Nucleus_*,_false>._M_head_impl;
}

Assistant:

NucleusPtr create_nucleus(const VarMap& var_map, std::size_t index) {
  const auto& species = var_map["projectile"]
                        .as<std::vector<std::string>>().at(index);
  const auto& nucleon_width = var_map["nucleon-width"] .as<double>();
  return Nucleus::create(species, nucleon_width);
}